

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O0

void Js::DynamicProfileInfo::DumpProfiledValue(char16 *name,ValueType *value,uint count)

{
  char16_t *form;
  char local_128 [8];
  char valueStr [256];
  uint local_20;
  uint i;
  uint count_local;
  ValueType *value_local;
  char16 *name_local;
  
  if (count != 0) {
    Output::Print(L"    %-16s(%2d):",name,(ulong)count);
    for (local_20 = 0; local_20 < count; local_20 = local_20 + 1) {
      form = L" ";
      if (local_20 != 0 && local_20 % 10 == 0) {
        form = L"\n                          ";
      }
      Output::Print(form);
      Output::Print(L"%2d:",(ulong)local_20);
      ValueType::ToString(value + local_20,(char (*) [256])local_128);
      Output::Print(L"  %S",local_128);
    }
    Output::Print(L"\n");
  }
  return;
}

Assistant:

void DynamicProfileInfo::DumpProfiledValue(char16 const * name, ValueType * value, uint count)
    {
        if (count != 0)
        {
            Output::Print(_u("    %-16s(%2d):"), name, count);
            for (uint i = 0; i < count; i++)
            {
                Output::Print(i != 0 && (i % 10) == 0 ? _u("\n                          ") : _u(" "));
                Output::Print(_u("%2d:"), i);
                char valueStr[VALUE_TYPE_MAX_STRING_SIZE];
                value[i].ToString(valueStr);
                Output::Print(_u("  %S"), valueStr);
            }
            Output::Print(_u("\n"));
        }
    }